

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttr.cpp
# Opt level: O0

int OpCodeAttr::GetOpCodeAttributes(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint opIndex;
  uint opIndex_1;
  OpCode op_local;
  
  opIndex._2_2_ = op;
  if (op < InvalidOpCode) {
    bVar2 = Js::operator<((OpCode *)((long)&opIndex + 2),0x100);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                         ,0x51,"(op < (sizeof(*__countof_helper(OpcodeAttributes)) + 0))",
                         "op < (sizeof(*__countof_helper(OpcodeAttributes)) + 0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(OpcodeAttributes + (long)(int)(uint)opIndex._2_2_ * 4);
  }
  else if (op < ByteCodeLast) {
    uVar3 = Js::operator+(MaxByteSizedOpcodes,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x88 < uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                         ,0x57,
                         "(opIndex < (sizeof(*__countof_helper(ExtendedOpcodeAttributes)) + 0))",
                         "opIndex < (sizeof(*__countof_helper(ExtendedOpcodeAttributes)) + 0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(ExtendedOpcodeAttributes + (ulong)uVar3 * 4);
  }
  else {
    uVar3 = Js::operator+(ByteCodeLast,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x328 < uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                         ,0x5b,
                         "(opIndex < (sizeof(*__countof_helper(BackendOpCodeAttributes)) + 0))",
                         "opIndex < (sizeof(*__countof_helper(BackendOpCodeAttributes)) + 0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(BackendOpCodeAttributes + (ulong)uVar3 * 4);
  }
  return opIndex_1;
}

Assistant:

static const int GetOpCodeAttributes(Js::OpCode op)
{
    if (op <= Js::OpCode::MaxByteSizedOpcodes)
    {
        AnalysisAssert(op < _countof(OpcodeAttributes));
        return OpcodeAttributes[(int)op];
    }
    else if (op < Js::OpCode::ByteCodeLast)
    {
        uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeAttributes));
        return ExtendedOpcodeAttributes[opIndex];
    }
    uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
    AnalysisAssert(opIndex < _countof(BackendOpCodeAttributes));
    return BackendOpCodeAttributes[opIndex];
}